

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall spdlog::spdlog_ex::~spdlog_ex(spdlog_ex *this)

{
  *(undefined ***)this = &PTR__spdlog_ex_004a81b0;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

class SPDLOG_API spdlog_ex : public std::exception {
public:
    explicit spdlog_ex(std::string msg);
    spdlog_ex(const std::string &msg, int last_errno);
    const char *what() const SPDLOG_NOEXCEPT override;

private:
    std::string msg_;
}